

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void * ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,void *ptr,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,U32 forCCtx)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  uint *in_RDX;
  void *in_RSI;
  void *in_RDI;
  int in_R8D;
  size_t tableSpace;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  uint local_58;
  uint local_54;
  long local_50;
  void *local_10;
  
  if (in_RDX[6] == 1) {
    local_50 = 0;
  }
  else {
    local_50 = 1L << ((byte)in_RDX[1] & 0x3f);
  }
  lVar1 = 1L << ((byte)in_RDX[2] & 0x3f);
  if ((in_R8D == 0) || (in_RDX[4] != 3)) {
    local_58 = 0;
  }
  else {
    if (*in_RDX < 0x12) {
      local_54 = *in_RDX;
    }
    else {
      local_54 = 0x11;
    }
    local_58 = local_54;
  }
  lVar2 = 1L << ((byte)local_58 & 0x3f);
  *(uint *)((long)in_RDI + 0x2c) = local_58;
  memset(in_RDI,0,0x20);
  ZSTD_invalidateMatchState((ZSTD_matchState_t *)0x1fd0f7);
  local_10 = in_RSI;
  if ((in_R8D != 0) && (in_RDX[6] == 7 || in_RDX[6] == 8)) {
    *(void **)((long)in_RDI + 0x48) = in_RSI;
    *(long *)((long)in_RDI + 0x50) = *(long *)((long)in_RDI + 0x48) + 0x400;
    *(long *)((long)in_RDI + 0x58) = *(long *)((long)in_RDI + 0x50) + 0x90;
    *(long *)((long)in_RDI + 0x60) = *(long *)((long)in_RDI + 0x58) + 0xd4;
    *(long *)((long)in_RDI + 0x68) = *(long *)((long)in_RDI + 0x60) + 0x80;
    *(long *)((long)in_RDI + 0x70) = *(long *)((long)in_RDI + 0x68) + 0x8008;
    local_10 = (void *)(*(long *)((long)in_RDI + 0x70) + 0x1c01c);
  }
  if (in_ECX != 1) {
    memset(local_10,0,(local_50 + lVar1 + lVar2) * 4);
  }
  *(void **)((long)in_RDI + 0x30) = local_10;
  *(long *)((long)in_RDI + 0x40) = *(long *)((long)in_RDI + 0x30) + lVar1 * 4;
  *(long *)((long)in_RDI + 0x38) = *(long *)((long)in_RDI + 0x40) + local_50 * 4;
  return (void *)(*(long *)((long)in_RDI + 0x38) + lVar2 * 4);
}

Assistant:

static void*
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      void* ptr,
                const ZSTD_compressionParameters* cParams,
                      ZSTD_compResetPolicy_e const crp, U32 const forCCtx)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->searchLength==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = ((size_t)1) << hashLog3;
    size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);

    assert(((size_t)ptr & 3) == 0);

    ms->hashLog3 = hashLog3;
    memset(&ms->window, 0, sizeof(ms->window));
    ZSTD_invalidateMatchState(ms);

    /* opt parser space */
    if (forCCtx && ((cParams->strategy == ZSTD_btopt) | (cParams->strategy == ZSTD_btultra))) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (U32*)ptr;
        ms->opt.litLengthFreq = ms->opt.litFreq + (1<<Litbits);
        ms->opt.matchLengthFreq = ms->opt.litLengthFreq + (MaxLL+1);
        ms->opt.offCodeFreq = ms->opt.matchLengthFreq + (MaxML+1);
        ptr = ms->opt.offCodeFreq + (MaxOff+1);
        ms->opt.matchTable = (ZSTD_match_t*)ptr;
        ptr = ms->opt.matchTable + ZSTD_OPT_NUM+1;
        ms->opt.priceTable = (ZSTD_optimal_t*)ptr;
        ptr = ms->opt.priceTable + ZSTD_OPT_NUM+1;
    }

    /* table Space */
    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_noMemset);
    assert(((size_t)ptr & 3) == 0);  /* ensure ptr is properly aligned */
    if (crp!=ZSTDcrp_noMemset) memset(ptr, 0, tableSpace);   /* reset tables only */
    ms->hashTable = (U32*)(ptr);
    ms->chainTable = ms->hashTable + hSize;
    ms->hashTable3 = ms->chainTable + chainSize;
    ptr = ms->hashTable3 + h3Size;

    assert(((size_t)ptr & 3) == 0);
    return ptr;
}